

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O1

int dprintf_formatf(void *data,_func_int_int_FILE_ptr *stream,char *format,__va_list_tag *ap_save)

{
  char *pcVar1;
  byte *__nptr;
  byte bVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  size_t sVar10;
  ulong uVar11;
  size_t *psVar12;
  uint uVar13;
  uint uVar14;
  char *pcVar15;
  size_t sVar16;
  size_t maxlength;
  int *piVar17;
  ulong *puVar18;
  undefined8 *puVar19;
  uint *puVar20;
  size_t sVar21;
  int *piVar22;
  uint uVar23;
  byte *pbVar24;
  long lVar25;
  uint uVar26;
  long lVar27;
  ulong unaff_R15;
  bool bVar28;
  char formatbuf [32];
  char work [256];
  va_stack_t vto [128];
  char *endpos [128];
  ulong local_15a8;
  ulong local_1588;
  undefined8 *local_1580;
  char *local_1578;
  ulong local_1570;
  __va_list_tag *local_1568;
  char *local_1560;
  char local_1558 [32];
  undefined8 local_1538;
  char local_1439;
  int local_1438;
  undefined4 uStack_1434;
  undefined1 auStack_1430 [8];
  undefined8 uStack_1428;
  ulong uStack_1420;
  size_t asStack_1418 [508];
  undefined8 local_438 [129];
  
  bVar2 = *format;
  iVar4 = 0;
  local_1568 = ap_save;
  local_1538 = (byte *)format;
  if (bVar2 != 0) {
    puVar19 = local_438;
    unaff_R15 = 0x900003ff6c09;
    uVar7 = 0;
LAB_005631e1:
    pbVar24 = local_1538 + 1;
    while (local_1538 = pbVar24, bVar2 == 0x25) {
      if (*local_1538 != 0x25) {
        iVar4 = iVar4 + 1;
        uVar6 = dprintf_DollarString((char *)local_1538,(char **)&local_1538);
        uVar11 = (long)iVar4;
        if (uVar6 != 0) {
          uVar11 = uVar6;
        }
        if ((long)uVar7 < (long)uVar11) {
          uVar7 = uVar11;
        }
        uVar6 = 0;
        local_1588 = 0;
        uVar26 = 0;
        local_15a8 = uVar7;
        pbVar24 = local_1538;
        goto switchD_0056328a_caseD_1;
      }
      bVar2 = local_1538[1];
      pbVar24 = local_1538 + 2;
      if (bVar2 == 0) {
        local_1538 = local_1538 + 1;
        goto LAB_00563695;
      }
    }
    goto LAB_00563677;
  }
  uVar7 = 0;
LAB_00563695:
  if (0 < (long)uVar7) {
    piVar22 = &local_1438;
    uVar11 = 1;
    do {
      if (((long)uVar11 < (long)uVar7) && (piVar22[8] == 9)) {
        uVar26 = local_1568->gp_offset;
        if ((ulong)uVar26 < 0x29) {
          piVar17 = (int *)((ulong)uVar26 + (long)local_1568->reg_save_area);
          local_1568->gp_offset = uVar26 + 8;
        }
        else {
          piVar17 = (int *)local_1568->overflow_arg_area;
          local_1568->overflow_arg_area = piVar17 + 2;
        }
        *(long *)(piVar22 + 0xe) = (long)*piVar17;
      }
      switch(*piVar22) {
      case 0:
      case 1:
      case 2:
      case 4:
switchD_0056370e_caseD_0:
        uVar26 = local_1568->gp_offset;
        if ((ulong)uVar26 < 0x29) {
          puVar18 = (ulong *)((ulong)uVar26 + (long)local_1568->reg_save_area);
          local_1568->gp_offset = uVar26 + 8;
        }
        else {
          puVar18 = (ulong *)local_1568->overflow_arg_area;
          local_1568->overflow_arg_area = puVar18 + 1;
        }
        uVar6 = *puVar18;
        goto LAB_00563738;
      case 3:
        uVar26 = piVar22[1];
        if ((((~uVar26 & 0x240) == 0) || ((uVar26 & 0x40) != 0)) || ((~uVar26 & 0x220) == 0))
        goto switchD_0056370e_caseD_0;
        uVar13 = local_1568->gp_offset;
        uVar6 = (ulong)uVar13;
        if ((uVar26 & 0x20) == 0) {
          if ((uVar26 >> 9 & 1) == 0) {
            if (uVar13 < 0x29) {
              piVar17 = (int *)(uVar6 + (long)local_1568->reg_save_area);
              local_1568->gp_offset = uVar13 + 8;
            }
            else {
              piVar17 = (int *)local_1568->overflow_arg_area;
              local_1568->overflow_arg_area = piVar17 + 2;
            }
            uVar6 = (ulong)*piVar17;
          }
          else {
            if (uVar13 < 0x29) {
              puVar20 = (uint *)(uVar6 + (long)local_1568->reg_save_area);
              local_1568->gp_offset = uVar13 + 8;
            }
            else {
              puVar20 = (uint *)local_1568->overflow_arg_area;
              local_1568->overflow_arg_area = puVar20 + 2;
            }
            uVar6 = (ulong)*puVar20;
          }
        }
        else {
          if (uVar13 < 0x29) {
            puVar18 = (ulong *)((long)local_1568->reg_save_area + uVar6);
            local_1568->gp_offset = uVar13 + 8;
          }
          else {
            puVar18 = (ulong *)local_1568->overflow_arg_area;
            local_1568->overflow_arg_area = puVar18 + 1;
          }
          uVar6 = *puVar18;
        }
LAB_00563738:
        *(ulong *)(piVar22 + 6) = uVar6;
        break;
      case 7:
        uVar26 = local_1568->fp_offset;
        if ((ulong)uVar26 < 0xa1) {
          puVar19 = (undefined8 *)((ulong)uVar26 + (long)local_1568->reg_save_area);
          local_1568->fp_offset = uVar26 + 0x10;
        }
        else {
          puVar19 = (undefined8 *)local_1568->overflow_arg_area;
          local_1568->overflow_arg_area = puVar19 + 1;
        }
        *(undefined8 *)(piVar22 + 6) = *puVar19;
        break;
      case 9:
        *piVar22 = 3;
      }
      piVar22 = piVar22 + 8;
      bVar28 = uVar11 != uVar7;
      uVar11 = uVar11 + 1;
    } while (bVar28);
  }
  local_1580 = local_438;
  local_1588 = 0;
  uVar26 = 0;
  local_1560 = "0123456789abcdefghijklmnopqrstuvwxyz";
  local_1578 = format;
  local_1568 = (__va_list_tag *)local_1580;
LAB_0056387c:
  if (*local_1578 == '%') {
    pcVar15 = local_1578 + 1;
    if (local_1578[1] == '%') {
      local_1578 = local_1578 + 2;
      iVar4 = (*stream)(0x25,(FILE *)data);
      if (iVar4 == -1) {
        uVar13 = 1;
        local_15a8 = (ulong)uVar26;
      }
      else {
        uVar13 = 0;
        uVar26 = uVar26 + 1;
      }
      goto LAB_00564338;
    }
    local_1578 = pcVar15;
    lVar9 = dprintf_DollarString(pcVar15,&local_1578);
    uVar7 = lVar9 + -1;
    if (lVar9 == 0) {
      uVar7 = local_1588;
    }
    lVar9 = uVar7 * 0x20;
    psVar12 = (size_t *)(auStack_1430 + lVar9);
    uVar13 = *(uint *)(auStack_1430 + lVar9 + -4);
    if ((uVar13 >> 0xe & 1) != 0) {
      psVar12 = asStack_1418 + *psVar12 * 4 + -1;
    }
    sVar10 = *psVar12;
    if ((uVar13 >> 0x10 & 1) == 0) {
      local_1588 = local_1588 + 1;
      sVar21 = 0xffffffffffffffff;
      if ((short)uVar13 < 0) {
        sVar21 = (&uStack_1428)[uVar7 * 4];
      }
    }
    else {
      sVar21 = asStack_1418[(&uStack_1428)[uVar7 * 4] * 4 + -1];
      local_1588 = local_1588 + 2;
    }
    uVar23 = uVar26;
    if (6 < (&local_1438)[uVar7 * 8] - 1U) goto switchD_005639bd_caseD_5;
    uVar14 = uVar13 >> 3 & 1;
    iVar4 = (int)sVar10;
    switch((&local_1438)[uVar7 * 8]) {
    case 1:
      pcVar15 = (char *)asStack_1418[uVar7 * 4 + -1];
      if (pcVar15 == (char *)0x0) {
        if (sVar21 == 0xffffffffffffffff || 4 < (long)sVar21) {
          *(uint *)(auStack_1430 + lVar9 + -4) = uVar13 & 0xfffffff7;
          sVar21 = 5;
          pcVar15 = "(nil)";
        }
        else {
          pcVar15 = "";
          sVar21 = 0;
        }
      }
      else if (sVar21 == 0xffffffffffffffff) {
        sVar21 = strlen(pcVar15);
      }
      if ((auStack_1430[lVar9 + -4] & 8) == 0) {
LAB_00563d9b:
        lVar8 = sVar10 - sVar21;
        if ((auStack_1430[lVar9 + -4] & 4) == 0) {
          if (lVar8 < 1) {
            lVar8 = lVar8 + -1;
          }
          else {
            iVar4 = iVar4 + uVar26;
            do {
              iVar5 = (*stream)(0x20,(FILE *)data);
              if (iVar5 == -1) goto LAB_00563de9;
              uVar26 = uVar26 + 1;
              lVar27 = lVar8 + -1;
              bVar28 = 0 < lVar8;
              lVar8 = lVar27;
            } while (lVar27 != 0 && bVar28);
            lVar8 = -1;
            uVar26 = iVar4 - (int)sVar21;
          }
        }
        if (sVar21 != 0) {
          sVar10 = 0;
          do {
            iVar4 = (int)sVar10;
            if (pcVar15[sVar10] == '\0') break;
            iVar4 = (*stream)((int)pcVar15[sVar10],(FILE *)data);
            if (iVar4 == -1) {
              uVar26 = uVar26 + (int)sVar10;
              goto LAB_00563ee4;
            }
            sVar10 = sVar10 + 1;
            iVar4 = (int)sVar21;
          } while (sVar21 != sVar10);
          uVar26 = iVar4 + uVar26;
        }
        uVar23 = uVar26;
        if (((auStack_1430[lVar9 + -4] & 4) != 0) && (0 < lVar8)) {
          uVar23 = (int)lVar8 + uVar26;
          lVar8 = lVar8 + 1;
          do {
            iVar4 = (*stream)(0x20,(FILE *)data);
            if (iVar4 == -1) goto LAB_00563ee4;
            uVar26 = uVar26 + 1;
            lVar8 = lVar8 + -1;
          } while (1 < lVar8);
        }
        bVar28 = true;
        if ((auStack_1430[lVar9 + -4] & 8) != 0) {
          iVar4 = (*stream)(0x22,(FILE *)data);
          uVar26 = uVar23;
          if (iVar4 == -1) {
LAB_00563ee4:
            local_15a8._0_4_ = uVar26;
            bVar28 = false;
            uVar23 = (uint)local_15a8;
          }
          else {
            uVar23 = uVar23 + 1;
          }
        }
      }
      else {
        iVar5 = (*stream)(0x22,(FILE *)data);
        if (iVar5 != -1) {
          uVar26 = uVar26 + 1;
          goto LAB_00563d9b;
        }
LAB_00563de9:
        local_15a8._0_4_ = uVar26;
        bVar28 = false;
        uVar23 = (uint)local_15a8;
      }
      uVar13 = 1;
      if (!bVar28) goto LAB_0056432e;
      break;
    case 2:
      if (asStack_1418[uVar7 * 4 + -1] == 0) {
        if ((uVar13 & 4) == 0) {
          sVar10 = sVar10 - 5;
        }
        else {
          sVar16 = sVar10 - 6;
          bVar28 = 5 < (long)sVar10;
          sVar10 = sVar16;
          if (bVar28) {
            iVar4 = iVar4 + uVar26;
            do {
              iVar5 = (*stream)(0x20,(FILE *)data);
              if (iVar5 == -1) goto LAB_0056403f;
              uVar26 = uVar26 + 1;
              bVar28 = 0 < (long)sVar10;
              sVar10 = sVar10 - 1;
            } while (bVar28);
            sVar10 = 0xffffffffffffffff;
            uVar26 = iVar4 - 5;
          }
        }
        uVar23 = uVar26 + 5;
        cVar3 = '(';
        lVar8 = 0;
LAB_00563fa7:
        iVar4 = (*stream)((int)cVar3,(FILE *)data);
        if (iVar4 != -1) goto code_r0x00563fb8;
        uVar26 = uVar26 + (int)lVar8;
LAB_0056403f:
        uVar13 = 1;
        local_15a8 = (ulong)uVar26;
        uVar23 = uVar26;
        goto LAB_00564056;
      }
      local_1560 = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ";
      if ((uVar13 >> 0xc & 1) == 0) {
        local_1560 = "0123456789abcdefghijklmnopqrstuvwxyz";
      }
      uVar13 = 0x16;
      local_1570 = 0x10;
      local_1580 = (undefined8 *)0x0;
      uVar14 = 1;
      unaff_R15 = asStack_1418[uVar7 * 4 + -1];
      goto LAB_00564056;
    case 3:
      unaff_R15 = asStack_1418[uVar7 * 4 + -1];
      if ((uVar13 >> 0x11 & 1) != 0) {
        if ((uVar13 & 4) == 0) {
          if ((long)sVar10 < 2) {
            sVar10 = sVar10 - 1;
          }
          else {
            iVar4 = iVar4 + uVar26;
            do {
              iVar5 = (*stream)(0x20,(FILE *)data);
              if (iVar5 == -1) goto LAB_0056402d;
              uVar26 = uVar26 + 1;
              sVar10 = sVar10 - 1;
            } while (1 < (long)sVar10);
            sVar10 = 0;
            uVar26 = iVar4 - 1;
          }
        }
        iVar4 = (*stream)((uint)unaff_R15 & 0xff,(FILE *)data);
        uVar13 = 1;
        if (iVar4 == -1) {
LAB_0056402d:
          uVar13 = 1;
          local_15a8 = (ulong)uVar26;
          goto LAB_00564338;
        }
        uVar14 = uVar26 + 1;
        uVar23 = uVar14;
        if (((auStack_1430[lVar9 + -4] & 4) != 0) && (1 < (long)sVar10)) {
          uVar23 = uVar26 + (int)sVar10;
          lVar9 = sVar10 + 1;
          do {
            iVar4 = (*stream)(0x20,(FILE *)data);
            if (iVar4 == -1) {
              local_15a8 = (ulong)uVar14;
              uVar26 = uVar14;
              goto LAB_00564338;
            }
            uVar14 = uVar14 + 1;
            lVar9 = lVar9 + -1;
          } while (2 < lVar9);
        }
        break;
      }
      local_1580 = (undefined8 *)0x0;
      if ((uVar13 >> 10 & 1) == 0) {
        if ((uVar13 >> 0xb & 1) == 0) {
          local_1570 = 10;
          if ((uVar13 >> 9 & 1) == 0) {
            local_1580 = (undefined8 *)(unaff_R15 >> 0x3f);
            if ((long)unaff_R15 < 1) {
              unaff_R15 = -unaff_R15;
            }
          }
        }
        else {
          local_1560 = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ";
          if ((uVar13 >> 0xc & 1) == 0) {
            local_1560 = "0123456789abcdefghijklmnopqrstuvwxyz";
          }
          local_1570 = 0x10;
        }
      }
      else {
        local_1570 = 8;
      }
      goto LAB_00564068;
    case 4:
      if (((uVar13 & 0x40) == 0) && ((uVar13 & 0x20) == 0)) {
        if ((uVar13 & 0x10) == 0) {
          *(uint *)asStack_1418[uVar7 * 4 + -1] = uVar26;
        }
        else {
          *(short *)asStack_1418[uVar7 * 4 + -1] = (short)uVar26;
        }
      }
      else {
        *(long *)asStack_1418[uVar7 * 4 + -1] = (long)(int)uVar26;
      }
    default:
switchD_005639bd_caseD_5:
      break;
    case 7:
      local_1558[0x10] = '\0';
      local_1558[0x11] = '\0';
      local_1558[0x12] = '\0';
      local_1558[0x13] = '\0';
      local_1558[0x14] = '\0';
      local_1558[0x15] = '\0';
      local_1558[0x16] = '\0';
      local_1558[0x17] = '\0';
      local_1558[0x18] = '\0';
      local_1558[0x19] = '\0';
      local_1558[0x1a] = '\0';
      local_1558[0x1b] = '\0';
      local_1558[0x1c] = '\0';
      local_1558[0x1d] = '\0';
      local_1558[0x1e] = '\0';
      local_1558[0x1f] = '\0';
      local_1558[0] = '%';
      local_1558[1] = '\0';
      local_1558[2] = '\0';
      local_1558[3] = '\0';
      local_1558[4] = '\0';
      local_1558[5] = '\0';
      local_1558[6] = '\0';
      local_1558[7] = '\0';
      local_1558[8] = '\0';
      local_1558[9] = '\0';
      local_1558[10] = '\0';
      local_1558[0xb] = '\0';
      local_1558[0xc] = '\0';
      local_1558[0xd] = '\0';
      local_1558[0xe] = '\0';
      local_1558[0xf] = '\0';
      sVar10 = strlen(local_1558);
      if ((uVar13 >> 0xd & 1) == 0) {
        sVar21 = 0xffffffffffffffff;
        if ((uVar13 >> 0xe & 1) != 0) {
          psVar12 = asStack_1418 + *(long *)(auStack_1430 + lVar9) * 4 + -1;
          goto LAB_00563b8f;
        }
      }
      else {
        psVar12 = (size_t *)(auStack_1430 + lVar9);
LAB_00563b8f:
        sVar21 = *psVar12;
      }
      if ((short)uVar13 < 0) {
        sVar16 = (&uStack_1428)[uVar7 * 4];
      }
      else {
        sVar16 = 0xffffffffffffffff;
        if ((uVar13 >> 0x10 & 1) != 0) {
          sVar16 = asStack_1418[(&uStack_1428)[uVar7 * 4] * 4 + -1];
        }
      }
      pbVar24 = (byte *)(local_1558 + 1);
      if ((uVar13 & 4) != 0) {
        local_1558[1] = 0x2d;
        pbVar24 = (byte *)(local_1558 + 2);
      }
      if ((uVar13 & 2) != 0) {
        *pbVar24 = 0x2b;
        pbVar24 = pbVar24 + 1;
      }
      if ((uVar13 & 1) != 0) {
        *pbVar24 = 0x20;
        pbVar24 = pbVar24 + 1;
      }
      if ((auStack_1430[lVar9 + -4] & 8) != 0) {
        *pbVar24 = 0x23;
        pbVar24 = pbVar24 + 1;
      }
      maxlength = 0x20 - sVar10;
      *pbVar24 = 0;
      if (-1 < (long)sVar21) {
        iVar4 = curl_msnprintf((char *)pbVar24,maxlength,"%ld");
        pbVar24 = pbVar24 + iVar4;
        maxlength = maxlength - (long)iVar4;
      }
      if (-1 < (long)sVar16) {
        iVar4 = curl_msnprintf((char *)pbVar24,maxlength,".%ld",sVar16);
        pbVar24 = pbVar24 + iVar4;
      }
      if ((auStack_1430[lVar9 + -4] & 0x20) != 0) {
        *pbVar24 = 0x6c;
        pbVar24 = pbVar24 + 1;
      }
      uVar13 = *(uint *)(auStack_1430 + lVar9 + -4);
      if ((uVar13 >> 0x12 & 1) == 0) {
        bVar2 = 0x66;
        if ((uVar13 >> 0x13 & 1) != 0) {
          bVar2 = ((uVar13 >> 0xc & 1) == 0) << 5 | 0x47;
        }
      }
      else {
        bVar2 = ((uVar13 >> 0xc & 1) == 0) << 5 | 0x45;
      }
      *pbVar24 = bVar2;
      pbVar24[1] = 0;
      sprintf((char *)&local_1538,local_1558,(int)asStack_1418[uVar7 * 4 + -1]);
      bVar28 = (char)local_1538 == '\0';
      uVar13 = (uint)local_15a8;
      if (!bVar28) {
        iVar4 = (*stream)((uint)local_1538 & 0xff,(FILE *)data);
        pcVar15 = (char *)((long)&local_1538 + 1);
        while (uVar13 = uVar26, uVar23 = uVar26, iVar4 != -1) {
          uVar26 = uVar26 + 1;
          bVar28 = *pcVar15 == '\0';
          uVar13 = (uint)local_15a8;
          uVar23 = uVar26;
          if (bVar28) break;
          iVar4 = (*stream)((int)*pcVar15,(FILE *)data);
          pcVar15 = pcVar15 + 1;
        }
      }
      local_15a8._0_4_ = uVar13;
      uVar13 = 1;
      if (bVar28) break;
      goto LAB_0056432e;
    }
    goto LAB_00564316;
  }
  pcVar15 = local_1578;
  if (*local_1578 == '\0') {
    return uVar26;
  }
  do {
    iVar4 = (*stream)((int)*pcVar15,(FILE *)data);
    if (iVar4 == -1) {
      uVar13 = 1;
      local_15a8 = (ulong)uVar26;
      local_1578 = pcVar15;
      goto LAB_00564338;
    }
    uVar26 = uVar26 + 1;
    pcVar1 = pcVar15 + 1;
    pcVar15 = pcVar15 + 1;
  } while ((*pcVar1 != '\0') && (*pcVar1 != '%'));
  uVar13 = 0;
  local_1578 = pcVar15;
  goto LAB_00564338;
switchD_0056328a_caseD_1:
  local_1538 = pbVar24;
  __nptr = local_1538;
  bVar2 = *local_1538;
  uVar13 = bVar2 - 0x20;
  if (((0x2f < uVar13) || ((0x900003ff6c09U >> ((ulong)uVar13 & 0x3f) & 1) == 0)) &&
     ((0x12 < bVar2 - 0x68 || ((0x40211U >> (bVar2 - 0x68 & 0x1f) & 1) == 0)))) goto LAB_005633f1;
  pbVar24 = local_1538 + 1;
  if (bVar2 < 0x4c) {
    switch((ulong)uVar13) {
    case 0:
      uVar26 = uVar26 | 1;
      break;
    case 3:
      uVar26 = uVar26 | 8;
      break;
    case 10:
      uVar26 = uVar26 | 0x4000;
      iVar4 = iVar4 + 1;
      local_1538 = pbVar24;
      uVar7 = dprintf_DollarString((char *)pbVar24,(char **)&local_1538);
      uVar6 = (long)iVar4;
      if (uVar7 != 0) {
        uVar6 = uVar7;
      }
      pbVar24 = local_1538;
      if ((long)local_15a8 < (long)uVar6) {
        local_15a8 = uVar6;
      }
      break;
    case 0xb:
      uVar26 = uVar26 | 2;
      break;
    case 0xd:
      uVar26 = uVar26 & 0xfffffefb | 4;
      break;
    case 0xe:
      if (*pbVar24 == 0x2a) {
        uVar26 = uVar26 | 0x18000;
        local_1538 = local_1538 + 2;
        iVar4 = iVar4 + 1;
        uVar7 = dprintf_DollarString((char *)local_1538,(char **)&local_1538);
        local_1588 = (long)iVar4;
        if (uVar7 != 0) {
          local_1588 = uVar7;
        }
        pbVar24 = local_1538;
        if ((long)local_15a8 < (long)local_1588) {
          local_15a8 = local_1588;
        }
      }
      else {
        uVar26 = uVar26 | 0x8000;
        local_1538 = pbVar24;
        local_1588 = strtol((char *)pbVar24,(char **)&local_1538,10);
        pbVar24 = local_1538;
      }
      break;
    case 0x10:
      uVar26 = uVar26 | (~uVar26 & 4) << 6;
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x16:
    case 0x17:
    case 0x18:
    case 0x19:
      uVar26 = uVar26 | 0x2000;
      local_1538 = pbVar24;
      uVar6 = strtol((char *)__nptr,(char **)&local_1538,10);
      pbVar24 = local_1538;
    }
  }
  else if (bVar2 < 0x6c) {
    if (bVar2 == 0x4c) {
      uVar26 = uVar26 | 0x80;
    }
    else if (bVar2 == 0x4f) {
LAB_005633c1:
      uVar26 = uVar26 | 0x20;
    }
    else if (bVar2 == 0x68) {
      uVar26 = uVar26 | 0x10;
    }
  }
  else {
    if (bVar2 == 0x6c) {
      if ((uVar26 & 0x20) != 0) goto LAB_005633c9;
      goto LAB_005633c1;
    }
    if (bVar2 == 0x71) {
LAB_005633c9:
      uVar26 = uVar26 | 0x40;
    }
    else if (bVar2 == 0x7a) goto LAB_005633c1;
  }
  goto switchD_0056328a_caseD_1;
LAB_005633f1:
  lVar9 = uVar11 - 1;
  if (bVar2 < 0x58) {
    if (bVar2 == 0x45) {
      (&local_1438)[lVar9 * 8] = 7;
      uVar26 = uVar26 | 0x41000;
      goto LAB_005635c3;
    }
    if (bVar2 == 0x47) {
      (&local_1438)[lVar9 * 8] = 7;
      uVar26 = uVar26 | 0x81000;
      goto LAB_005635c3;
    }
    if (bVar2 == 0x53) {
      uVar26 = uVar26 | 8;
      goto switchD_00563425_caseD_73;
    }
    goto switchD_00563425_caseD_68;
  }
  switch(bVar2) {
  case 99:
    (&local_1438)[lVar9 * 8] = 3;
    uVar26 = uVar26 | 0x20000;
    break;
  case 100:
  case 0x69:
    (&local_1438)[lVar9 * 8] = 3;
    break;
  case 0x65:
    (&local_1438)[lVar9 * 8] = 7;
    uVar26 = uVar26 | 0x40000;
    break;
  case 0x66:
    (&local_1438)[lVar9 * 8] = 7;
    break;
  case 0x67:
    (&local_1438)[lVar9 * 8] = 7;
    uVar26 = uVar26 | 0x80000;
    break;
  case 0x6e:
    (&local_1438)[lVar9 * 8] = 4;
    break;
  case 0x6f:
    (&local_1438)[lVar9 * 8] = 3;
    uVar26 = uVar26 | 0x400;
    break;
  case 0x70:
    (&local_1438)[lVar9 * 8] = 2;
    break;
  case 0x73:
switchD_00563425_caseD_73:
    (&local_1438)[lVar9 * 8] = 1;
    break;
  case 0x75:
    (&local_1438)[lVar9 * 8] = 3;
    uVar26 = uVar26 | 0x200;
    break;
  case 0x78:
    (&local_1438)[lVar9 * 8] = 3;
    uVar26 = uVar26 | 0xa00;
    break;
  default:
    if (bVar2 == 0x58) {
      (&local_1438)[lVar9 * 8] = 3;
      uVar26 = uVar26 | 0x1a00;
      break;
    }
  case 0x68:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x71:
  case 0x72:
  case 0x74:
  case 0x76:
  case 0x77:
switchD_00563425_caseD_68:
    (&local_1438)[lVar9 * 8] = 0;
  }
LAB_005635c3:
  lVar8 = lVar9 * 0x20;
  *(uint *)(auStack_1430 + lVar8 + -4) = uVar26;
  *(ulong *)(auStack_1430 + lVar8) = uVar6;
  (&uStack_1428)[lVar9 * 4] = local_1588;
  if ((uVar26 >> 0xe & 1) != 0) {
    lVar9 = uVar6 - 1;
    *(long *)(auStack_1430 + lVar8) = lVar9;
    lVar8 = lVar9 * 0x20;
    (&local_1438)[lVar9 * 8] = 9;
    *(undefined8 *)(auStack_1430 + lVar8 + -4) = 0;
    *(undefined8 *)(auStack_1430 + lVar8 + 4) = 0;
    *(undefined4 *)((long)&uStack_1428 + lVar8 + 4) = 0;
  }
  if ((uVar26 >> 0x10 & 1) != 0) {
    lVar8 = local_1588 - 1;
    (&uStack_1428)[lVar9 * 4] = lVar8;
    lVar9 = lVar8 * 0x20;
    (&local_1438)[lVar8 * 8] = 9;
    *(undefined8 *)(auStack_1430 + lVar9 + -4) = 0;
    *(undefined8 *)(auStack_1430 + lVar9 + 4) = 0;
    *(undefined4 *)((long)&uStack_1428 + lVar9 + 4) = 0;
  }
  *puVar19 = local_1538 + 1;
  puVar19 = puVar19 + 1;
  uVar7 = local_15a8;
LAB_00563677:
  bVar2 = *local_1538;
  if (bVar2 == 0) goto LAB_00563695;
  goto LAB_005631e1;
code_r0x00563fb8:
  cVar3 = "(nil)"[lVar8 + 1];
  lVar8 = lVar8 + 1;
  if (lVar8 == 5) goto code_r0x00563fcc;
  goto LAB_00563fa7;
code_r0x00563fcc:
  uVar13 = 0;
  if ((auStack_1430[lVar9 + -4] & 4) == 0) {
    if ((long)sVar10 < 1) {
      sVar10 = sVar10 - 1;
    }
    else {
      iVar4 = (int)sVar10;
      do {
        iVar5 = (*stream)(0x20,(FILE *)data);
        if (iVar5 == -1) {
          sVar10 = sVar10 - 1;
          uVar13 = 1;
          local_15a8 = (ulong)uVar23;
          goto LAB_00564056;
        }
        uVar23 = uVar23 + 1;
        sVar16 = sVar10 - 1;
        bVar28 = 0 < (long)sVar10;
        sVar10 = sVar16;
      } while (sVar16 != 0 && bVar28);
      sVar10 = 0xffffffffffffffff;
      uVar23 = uVar26 + iVar4 + 5;
    }
  }
LAB_00564056:
  uVar26 = uVar23;
  uVar23 = uVar26;
  if (uVar13 == 0) {
LAB_00564316:
    local_1578 = *(char **)local_1568;
    local_1568 = (__va_list_tag *)((long)local_1568 + 8);
    uVar13 = 0;
  }
  else {
    if (uVar13 != 0x16) goto LAB_00564338;
LAB_00564068:
    uVar7 = local_1570;
    if (sVar21 == 0xffffffffffffffff) {
      sVar21 = 1;
    }
    lVar8 = 0xff;
    if (unaff_R15 == 0) {
      pcVar15 = &local_1439;
    }
    else {
      do {
        lVar27 = lVar8;
        *(char *)((long)&local_1538 + lVar27) = local_1560[unaff_R15 % local_1570];
        lVar8 = lVar27 + -1;
        bVar28 = local_1570 <= unaff_R15;
        unaff_R15 = unaff_R15 / local_1570;
      } while (bVar28);
      pcVar15 = local_1558 + lVar27 + 0x1f;
    }
    lVar25 = sVar10 - (0xff - lVar8);
    sVar10 = sVar21 - (0xff - lVar8);
    lVar27 = lVar8;
    if (((uVar14 != 0) && (local_1570 == 8)) && ((long)sVar10 < 1)) {
      *pcVar15 = '0';
      lVar25 = lVar25 + -1;
      lVar27 = lVar8 + -1;
    }
    if (0 < (long)sVar10) {
      lVar27 = lVar27 - (sVar21 + lVar8);
      memset((void *)((long)&local_1438 + lVar27),0x30,sVar10);
      lVar25 = lVar25 - sVar10;
      lVar27 = lVar27 + 0xff;
    }
    bVar2 = uVar7 == 0x10 & (byte)uVar14;
    lVar8 = lVar25 + -2;
    if (bVar2 == 0) {
      lVar8 = lVar25;
    }
    if (((int)local_1580 != 0) || ((auStack_1430[lVar9 + -4] & 3) != 0)) {
      lVar8 = lVar8 + -1;
    }
    if ((*(ushort *)(auStack_1430 + lVar9 + -4) & 0x104) == 0) {
      if (lVar8 < 1) {
        lVar8 = lVar8 + -1;
      }
      else {
        iVar4 = (int)lVar8;
        uVar23 = uVar26;
        do {
          iVar5 = (*stream)(0x20,(FILE *)data);
          if (iVar5 == -1) goto LAB_005642fd;
          uVar23 = uVar23 + 1;
          lVar25 = lVar8 + -1;
          bVar28 = 0 < lVar8;
          lVar8 = lVar25;
        } while (lVar25 != 0 && bVar28);
        lVar8 = -1;
        uVar26 = iVar4 + uVar26;
      }
    }
    if ((int)local_1580 == 0) {
      if ((*(uint *)(auStack_1430 + lVar9 + -4) & 2) != 0) {
        iVar4 = 0x2b;
        goto LAB_005641c3;
      }
      if ((*(uint *)(auStack_1430 + lVar9 + -4) & 1) != 0) {
        iVar4 = 0x20;
        goto LAB_005641c3;
      }
LAB_005641dc:
      uVar23 = uVar26;
      if (bVar2 == 0) {
LAB_0056423a:
        if ((*(uint *)(auStack_1430 + lVar9 + -4) & 0x104) == 0x100) {
          if (lVar8 < 1) {
            lVar8 = lVar8 + -1;
          }
          else {
            uVar26 = (int)lVar8 + uVar23;
            do {
              iVar4 = (*stream)(0x30,(FILE *)data);
              if (iVar4 == -1) goto LAB_005642fd;
              uVar23 = uVar23 + 1;
              lVar25 = lVar8 + -1;
              bVar28 = 0 < lVar8;
              lVar8 = lVar25;
            } while (lVar25 != 0 && bVar28);
            lVar8 = -1;
            uVar23 = uVar26;
          }
        }
        if (lVar27 < 0xff) {
          lVar27 = lVar27 + -1;
          do {
            iVar4 = (*stream)((int)*(undefined1 *)((long)&local_1538 + lVar27 + 2),(FILE *)data);
            if (iVar4 == -1) goto LAB_005642fd;
            uVar23 = uVar23 + 1;
            lVar27 = lVar27 + 1;
          } while (lVar27 < 0xfe);
        }
        bVar28 = true;
        uVar26 = (uint)local_15a8;
        if (((auStack_1430[lVar9 + -4] & 4) != 0) && (0 < lVar8)) {
          uVar14 = (int)lVar8 + uVar23;
          lVar8 = lVar8 + 1;
          uVar13 = uVar23;
          do {
            iVar4 = (*stream)(0x20,(FILE *)data);
            bVar28 = iVar4 != -1;
            uVar26 = uVar13;
            uVar23 = uVar13;
            if (iVar4 == -1) break;
            uVar13 = uVar13 + 1;
            lVar8 = lVar8 + -1;
            uVar26 = (uint)local_15a8;
            uVar23 = uVar14;
          } while (1 < lVar8);
        }
      }
      else {
        iVar4 = (*stream)(0x30,(FILE *)data);
        if (iVar4 == -1) goto LAB_005642fd;
        uVar23 = uVar26 + 1;
        if ((auStack_1430[lVar9 + -3] & 0x10) == 0) {
          iVar4 = 0x78;
        }
        else {
          iVar4 = 0x58;
        }
        iVar4 = (*stream)(iVar4,(FILE *)data);
        if (iVar4 != -1) {
          uVar23 = uVar26 + 2;
          goto LAB_0056423a;
        }
        bVar28 = false;
        uVar26 = uVar23;
      }
    }
    else {
      iVar4 = 0x2d;
LAB_005641c3:
      iVar4 = (*stream)(iVar4,(FILE *)data);
      uVar23 = uVar26;
      if (iVar4 != -1) {
        uVar26 = uVar26 + 1;
        goto LAB_005641dc;
      }
LAB_005642fd:
      bVar28 = false;
      uVar26 = uVar23;
    }
    local_15a8._0_4_ = uVar26;
    uVar13 = 1;
    unaff_R15 = 0;
    if (bVar28) goto LAB_00564316;
    unaff_R15 = 0;
  }
LAB_0056432e:
  local_15a8 = (ulong)(uint)local_15a8;
  uVar26 = uVar23;
LAB_00564338:
  if ((uVar13 & 0x1d) != 0) {
    return (uint)local_15a8;
  }
  goto LAB_0056387c;
}

Assistant:

static int dprintf_formatf(
  void *data, /* untouched by format(), just sent to the stream() function in
                 the second argument */
  /* function pointer called for each output character */
  int (*stream)(int, FILE *),
  const char *format,    /* %-formatted string */
  va_list ap_save) /* list of parameters */
{
  /* Base-36 digits for numbers.  */
  const char *digits = lower_digits;

  /* Pointer into the format string.  */
  char *f;

  /* Number of characters written.  */
  int done = 0;

  long param; /* current parameter to read */
  long param_num=0; /* parameter counter */

  va_stack_t vto[MAX_PARAMETERS];
  char *endpos[MAX_PARAMETERS];
  char **end;

  char work[BUFFSIZE];

  va_stack_t *p;

  /* Do the actual %-code parsing */
  dprintf_Pass1(format, vto, endpos, ap_save);

  end = &endpos[0]; /* the initial end-position from the list dprintf_Pass1()
                       created for us */

  f = (char *)format;
  while(*f != '\0') {
    /* Format spec modifiers.  */
    int is_alt;

    /* Width of a field.  */
    long width;

    /* Precision of a field.  */
    long prec;

    /* Decimal integer is negative.  */
    int is_neg;

    /* Base of a number to be written.  */
    long base;

    /* Integral values to be written.  */
    mp_uintmax_t num;

    /* Used to convert negative in positive.  */
    mp_intmax_t signed_num;

    if(*f != '%') {
      /* This isn't a format spec, so write everything out until the next one
         OR end of string is reached.  */
      do {
        OUTCHAR(*f);
      } while(*++f && ('%' != *f));
      continue;
    }

    ++f;

    /* Check for "%%".  Note that although the ANSI standard lists
       '%' as a conversion specifier, it says "The complete format
       specification shall be `%%'," so we can avoid all the width
       and precision processing.  */
    if(*f == '%') {
      ++f;
      OUTCHAR('%');
      continue;
    }

    /* If this is a positional parameter, the position must follow immediately
       after the %, thus create a %<num>$ sequence */
    param=dprintf_DollarString(f, &f);

    if(!param)
      param = param_num;
    else
      --param;

    param_num++; /* increase this always to allow "%2$s %1$s %s" and then the
                    third %s will pick the 3rd argument */

    p = &vto[param];

    /* pick up the specified width */
    if(p->flags & FLAGS_WIDTHPARAM)
      width = (long)vto[p->width].data.num.as_signed;
    else
      width = p->width;

    /* pick up the specified precision */
    if(p->flags & FLAGS_PRECPARAM) {
      prec = (long)vto[p->precision].data.num.as_signed;
      param_num++; /* since the precision is extraced from a parameter, we
                      must skip that to get to the next one properly */
    }
    else if(p->flags & FLAGS_PREC)
      prec = p->precision;
    else
      prec = -1;

    is_alt = (p->flags & FLAGS_ALT) ? 1 : 0;

    switch (p->type) {
    case FORMAT_INT:
      num = p->data.num.as_unsigned;
      if(p->flags & FLAGS_CHAR) {
        /* Character.  */
        if(!(p->flags & FLAGS_LEFT))
          while(--width > 0)
            OUTCHAR(' ');
        OUTCHAR((char) num);
        if(p->flags & FLAGS_LEFT)
          while(--width > 0)
            OUTCHAR(' ');
        break;
      }
      if(p->flags & FLAGS_OCTAL) {
        /* Octal unsigned integer.  */
        base = 8;
        goto unsigned_number;
      }
      else if(p->flags & FLAGS_HEX) {
        /* Hexadecimal unsigned integer.  */

        digits = (p->flags & FLAGS_UPPER)? upper_digits : lower_digits;
        base = 16;
        goto unsigned_number;
      }
      else if(p->flags & FLAGS_UNSIGNED) {
        /* Decimal unsigned integer.  */
        base = 10;
        goto unsigned_number;
      }

      /* Decimal integer.  */
      base = 10;

      is_neg = (p->data.num.as_signed < (mp_intmax_t)0) ? 1 : 0;
      if(is_neg) {
        /* signed_num might fail to hold absolute negative minimum by 1 */
        signed_num = p->data.num.as_signed + (mp_intmax_t)1;
        signed_num = -signed_num;
        num = (mp_uintmax_t)signed_num;
        num += (mp_uintmax_t)1;
      }

      goto number;

      unsigned_number:
      /* Unsigned number of base BASE.  */
      is_neg = 0;

      number:
      /* Number of base BASE.  */
      {
        char *workend = &work[sizeof(work) - 1];
        char *w;

        /* Supply a default precision if none was given.  */
        if(prec == -1)
          prec = 1;

        /* Put the number in WORK.  */
        w = workend;
        while(num > 0) {
          *w-- = digits[num % base];
          num /= base;
        }
        width -= (long)(workend - w);
        prec -= (long)(workend - w);

        if(is_alt && base == 8 && prec <= 0) {
          *w-- = '0';
          --width;
        }

        if(prec > 0) {
          width -= prec;
          while(prec-- > 0)
            *w-- = '0';
        }

        if(is_alt && base == 16)
          width -= 2;

        if(is_neg || (p->flags & FLAGS_SHOWSIGN) || (p->flags & FLAGS_SPACE))
          --width;

        if(!(p->flags & FLAGS_LEFT) && !(p->flags & FLAGS_PAD_NIL))
          while(width-- > 0)
            OUTCHAR(' ');

        if(is_neg)
          OUTCHAR('-');
        else if(p->flags & FLAGS_SHOWSIGN)
          OUTCHAR('+');
        else if(p->flags & FLAGS_SPACE)
          OUTCHAR(' ');

        if(is_alt && base == 16) {
          OUTCHAR('0');
          if(p->flags & FLAGS_UPPER)
            OUTCHAR('X');
          else
            OUTCHAR('x');
        }

        if(!(p->flags & FLAGS_LEFT) && (p->flags & FLAGS_PAD_NIL))
          while(width-- > 0)
            OUTCHAR('0');

        /* Write the number.  */
        while(++w <= workend) {
          OUTCHAR(*w);
        }

        if(p->flags & FLAGS_LEFT)
          while(width-- > 0)
            OUTCHAR(' ');
      }
      break;

    case FORMAT_STRING:
            /* String.  */
      {
        static const char null[] = "(nil)";
        const char *str;
        size_t len;

        str = (char *) p->data.str;
        if(str == NULL) {
          /* Write null[] if there's space.  */
          if(prec == -1 || prec >= (long) sizeof(null) - 1) {
            str = null;
            len = sizeof(null) - 1;
            /* Disable quotes around (nil) */
            p->flags &= (~FLAGS_ALT);
          }
          else {
            str = "";
            len = 0;
          }
        }
        else if(prec != -1)
          len = (size_t)prec;
        else
          len = strlen(str);

        width -= (long)len;

        if(p->flags & FLAGS_ALT)
          OUTCHAR('"');

        if(!(p->flags&FLAGS_LEFT))
          while(width-- > 0)
            OUTCHAR(' ');

        while((len-- > 0) && *str)
          OUTCHAR(*str++);
        if(p->flags&FLAGS_LEFT)
          while(width-- > 0)
            OUTCHAR(' ');

        if(p->flags & FLAGS_ALT)
          OUTCHAR('"');
      }
      break;

    case FORMAT_PTR:
      /* Generic pointer.  */
      {
        void *ptr;
        ptr = (void *) p->data.ptr;
        if(ptr != NULL) {
          /* If the pointer is not NULL, write it as a %#x spec.  */
          base = 16;
          digits = (p->flags & FLAGS_UPPER)? upper_digits : lower_digits;
          is_alt = 1;
          num = (size_t) ptr;
          is_neg = 0;
          goto number;
        }
        else {
          /* Write "(nil)" for a nil pointer.  */
          static const char strnil[] = "(nil)";
          const char *point;

          width -= (long)(sizeof(strnil) - 1);
          if(p->flags & FLAGS_LEFT)
            while(width-- > 0)
              OUTCHAR(' ');
          for(point = strnil; *point != '\0'; ++point)
            OUTCHAR(*point);
          if(! (p->flags & FLAGS_LEFT))
            while(width-- > 0)
              OUTCHAR(' ');
        }
      }
      break;

    case FORMAT_DOUBLE:
      {
        char formatbuf[32]="%";
        char *fptr = &formatbuf[1];
        size_t left = sizeof(formatbuf)-strlen(formatbuf);
        int len;

        width = -1;
        if(p->flags & FLAGS_WIDTH)
          width = p->width;
        else if(p->flags & FLAGS_WIDTHPARAM)
          width = (long)vto[p->width].data.num.as_signed;

        prec = -1;
        if(p->flags & FLAGS_PREC)
          prec = p->precision;
        else if(p->flags & FLAGS_PRECPARAM)
          prec = (long)vto[p->precision].data.num.as_signed;

        if(p->flags & FLAGS_LEFT)
          *fptr++ = '-';
        if(p->flags & FLAGS_SHOWSIGN)
          *fptr++ = '+';
        if(p->flags & FLAGS_SPACE)
          *fptr++ = ' ';
        if(p->flags & FLAGS_ALT)
          *fptr++ = '#';

        *fptr = 0;

        if(width >= 0) {
          /* RECURSIVE USAGE */
          len = curl_msnprintf(fptr, left, "%ld", width);
          fptr += len;
          left -= len;
        }
        if(prec >= 0) {
          /* RECURSIVE USAGE */
          len = curl_msnprintf(fptr, left, ".%ld", prec);
          fptr += len;
        }
        if(p->flags & FLAGS_LONG)
          *fptr++ = 'l';

        if(p->flags & FLAGS_FLOATE)
          *fptr++ = (char)((p->flags & FLAGS_UPPER) ? 'E':'e');
        else if(p->flags & FLAGS_FLOATG)
          *fptr++ = (char)((p->flags & FLAGS_UPPER) ? 'G' : 'g');
        else
          *fptr++ = 'f';

        *fptr = 0; /* and a final zero termination */

        /* NOTE NOTE NOTE!! Not all sprintf implementations return number of
           output characters */
        (sprintf)(work, formatbuf, p->data.dnum);

        for(fptr=work; *fptr; fptr++)
          OUTCHAR(*fptr);
      }
      break;

    case FORMAT_INTPTR:
      /* Answer the count of characters written.  */
#ifdef HAVE_LONG_LONG_TYPE
      if(p->flags & FLAGS_LONGLONG)
        *(LONG_LONG_TYPE *) p->data.ptr = (LONG_LONG_TYPE)done;
      else
#endif
        if(p->flags & FLAGS_LONG)
          *(long *) p->data.ptr = (long)done;
      else if(!(p->flags & FLAGS_SHORT))
        *(int *) p->data.ptr = (int)done;
      else
        *(short *) p->data.ptr = (short)done;
      break;

    default:
      break;
    }
    f = *end++; /* goto end of %-code */

  }
  return done;
}